

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

DivideBroadcastableLayerParams *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::DivideBroadcastableLayerParams>(Arena *arena)

{
  DivideBroadcastableLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (DivideBroadcastableLayerParams *)operator_new(0x18);
    CoreML::Specification::DivideBroadcastableLayerParams::DivideBroadcastableLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (DivideBroadcastableLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x18,
                      (type_info *)&CoreML::Specification::DivideBroadcastableLayerParams::typeinfo)
    ;
    CoreML::Specification::DivideBroadcastableLayerParams::DivideBroadcastableLayerParams
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }